

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<DimensionPrinter>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<DimensionPrinter>>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
           *this)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  VarHandler *in_RDI;
  int i;
  double infinity;
  int num_bounds;
  VarHandler bh;
  double ub;
  double lb;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
  *in_stack_ffffffffffffff98;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
  *in_stack_ffffffffffffffa0;
  int index;
  BasicCStringRef<char> local_48;
  BasicCStringRef<char> local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  CStringRef arg0;
  VarHandler local_20;
  char *local_18;
  char *local_10;
  
  BinaryReaderBase::ReadTillEndOfLine
            ((BinaryReaderBase *)
             (in_RDI->
             super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>::ItemType)0>
             ).reader_);
  local_10 = (char *)0x0;
  local_18 = (char *)0x0;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
  ::VarHandler::VarHandler((VarHandler *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
          ::VarHandler::num_items(&local_20);
  arg0.data_ = (char *)0x7ff0000000000000;
  for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
    cVar1 = ReaderBase::ReadChar
                      ((ReaderBase *)
                       (in_RDI->
                       super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>::ItemType)0>
                       ).reader_);
    uVar3 = (ulong)((int)cVar1 - 0x30);
    switch(uVar3) {
    case 0:
      local_10 = (char *)BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                                   ((BinaryReader<mp::internal::EndiannessConverter> *)
                                    in_stack_ffffffffffffffa0);
      local_18 = (char *)BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                                   ((BinaryReader<mp::internal::EndiannessConverter> *)
                                    in_stack_ffffffffffffffa0);
      break;
    case 1:
      local_10 = arg0.data_ ^ 0x8000000000000000;
      local_18 = (char *)BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                                   ((BinaryReader<mp::internal::EndiannessConverter> *)
                                    in_stack_ffffffffffffffa0);
      break;
    case 2:
      local_10 = (char *)BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                                   ((BinaryReader<mp::internal::EndiannessConverter> *)
                                    in_stack_ffffffffffffffa0);
      local_18 = arg0.data_;
      break;
    case 3:
      local_10 = arg0.data_ ^ 0x8000000000000000;
      local_18 = arg0.data_;
      break;
    case 4:
      local_10 = (char *)BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
                                   ((BinaryReader<mp::internal::EndiannessConverter> *)
                                    in_stack_ffffffffffffffa0);
      local_18 = local_10;
      break;
    case 5:
      in_stack_ffffffffffffffa0 =
           (in_RDI->
           super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>::ItemType)0>
           ).reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_40,"COMPL bound type is invalid for variables");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),arg0);
      break;
    default:
      in_stack_ffffffffffffff98 =
           (in_RDI->
           super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>::ItemType)0>
           ).reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"expected bound");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),arg0);
    }
    index = (int)(uVar3 >> 0x20);
    BinaryReaderBase::ReadTillEndOfLine
              ((BinaryReaderBase *)
               (in_RDI->
               super_ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>::ItemType)0>
               ).reader_);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
    ::VarHandler::SetBounds
              (in_RDI,index,(double)in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}